

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O1

void __thiscall Memory::LargeHeapBlock::WBClearBit(LargeHeapBlock *this,char *addr)

{
  int iVar1;
  
  iVar1 = *(int *)&(this->super_HeapBlock).address;
  CCLock::Enter(&wbVerifyBitsLock.super_CCLock);
  BVSparse<Memory::HeapAllocator>::Clear(&this->wbVerifyBits,(uint)((int)addr - iVar1) >> 3);
  CCLock::Leave(&wbVerifyBitsLock.super_CCLock);
  return;
}

Assistant:

void LargeHeapBlock::WBClearBit(char* addr)
{
    uint index = (uint)(addr - this->address) / sizeof(void*);
    AutoCriticalSection autoCs(&wbVerifyBitsLock);
    wbVerifyBits.Clear(index);
}